

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  sqlite3 *psVar3;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  Trigger *pTrig;
  HashElem *pEntry;
  Db *pDb;
  int i;
  sqlite3 *db;
  char *zName;
  char zErr [128];
  char *in_stack_ffffffffffffff28;
  sqlite3 *in_stack_ffffffffffffff30;
  undefined1 *puVar4;
  HashElem *pHVar5;
  sqlite3 *db_00;
  int local_b4;
  uchar *local_a8;
  char local_88 [104];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = sqlite3_value_text((sqlite3_value *)0x220b57);
  psVar3 = sqlite3_context_db_handle(in_RDI);
  db_00 = (sqlite3 *)0x0;
  puVar4 = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_88,0xaa,0x80);
  if (local_a8 == (uchar *)0x0) {
    local_a8 = "";
  }
  local_b4 = 0;
  while ((local_b4 < psVar3->nDb &&
         ((db_00 = (sqlite3 *)(psVar3->aDb + local_b4), db_00->pVdbe == (Vdbe *)0x0 ||
          (iVar2 = sqlite3DbIsNamed(db_00,(int)((ulong)puVar4 >> 0x20),
                                    (char *)in_stack_ffffffffffffff30), iVar2 == 0))))) {
    local_b4 = local_b4 + 1;
  }
  if (local_b4 < psVar3->nDb) {
    if (local_b4 < 2) {
      sqlite3_snprintf(0x80,local_88,"cannot detach database %s",local_a8);
    }
    else {
      iVar2 = sqlite3BtreeTxnState((Btree *)db_00->pVdbe);
      if ((iVar2 == 0) && (iVar2 = sqlite3BtreeIsInBackup((Btree *)db_00->pVdbe), iVar2 == 0)) {
        for (pHVar5 = ((psVar3->aDb[1].pSchema)->trigHash).first; pHVar5 != (HashElem *)0x0;
            pHVar5 = pHVar5->next) {
          in_stack_ffffffffffffff30 = (sqlite3 *)pHVar5->data;
          if (((BtLock *)&in_stack_ffffffffffffff30->flags)->pBtree == (Btree *)db_00->mutex) {
            ((BtLock *)&in_stack_ffffffffffffff30->flags)->pBtree =
                 *(Btree **)&in_stack_ffffffffffffff30->nDb;
          }
        }
        sqlite3BtreeClose((Btree *)in_stack_ffffffffffffff30);
        db_00->pVdbe = (Vdbe *)0x0;
        db_00->mutex = (sqlite3_mutex *)0x0;
        sqlite3CollapseDatabaseArray(in_stack_ffffffffffffff30);
        goto LAB_00220d64;
      }
      sqlite3_snprintf(0x80,local_88,"database %s is locked",local_a8);
    }
  }
  else {
    sqlite3_snprintf(0x80,local_88,"no such database: %s",local_a8);
  }
  sqlite3_result_error((sqlite3_context *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
LAB_00220d64:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  HashElem *pEntry;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3DbIsNamed(db, i, zName) ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeTxnState(pDb->pBt)!=SQLITE_TXN_NONE
   || sqlite3BtreeIsInBackup(pDb->pBt)
  ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  /* If any TEMP triggers reference the schema being detached, move those
  ** triggers to reference the TEMP schema itself. */
  assert( db->aDb[1].pSchema );
  pEntry = sqliteHashFirst(&db->aDb[1].pSchema->trigHash);
  while( pEntry ){
    Trigger *pTrig = (Trigger*)sqliteHashData(pEntry);
    if( pTrig->pTabSchema==pDb->pSchema ){
      pTrig->pTabSchema = pTrig->pSchema;
    }
    pEntry = sqliteHashNext(pEntry);
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}